

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall game::undoMove(game *this)

{
  reference __src;
  game *this_local;
  
  __src = std::stack<bitboards,_std::deque<bitboards,_std::allocator<bitboards>_>_>::top
                    (&this->boardHistory);
  memcpy(this,__src,100);
  std::stack<bitboards,_std::deque<bitboards,_std::allocator<bitboards>_>_>::pop
            (&this->boardHistory);
  std::stack<move,_std::deque<move,_std::allocator<move>_>_>::pop(&this->history);
  this->blacksTurn = (bool)((this->blacksTurn ^ 0xffU) & 1);
  return;
}

Assistant:

void game::undoMove() {
    boards = boardHistory.top();
    boardHistory.pop();
    history.pop();
    blacksTurn = !blacksTurn;
}